

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractsocket.cpp
# Opt level: O1

void __thiscall QAbstractSocketPrivate::resetSocketLayer(QAbstractSocketPrivate *this)

{
  this->hasPendingData = false;
  if (this->socketEngine != (QAbstractSocketEngine *)0x0) {
    (**(code **)(*(long *)this->socketEngine + 0xa8))();
    QObject::disconnect(&this->socketEngine->super_QObject,(char *)0x0,(QObject *)0x0,(char *)0x0);
    if (this->socketEngine != (QAbstractSocketEngine *)0x0) {
      (**(code **)(*(long *)this->socketEngine + 0x20))();
    }
    this->socketEngine = (QAbstractSocketEngine *)0x0;
    this->cachedSocketDescriptor = -1;
  }
  if (this->connectTimer != (QTimer *)0x0) {
    QTimer::stop();
    return;
  }
  return;
}

Assistant:

void QAbstractSocketPrivate::resetSocketLayer()
{
#if defined (QABSTRACTSOCKET_DEBUG)
    qDebug("QAbstractSocketPrivate::resetSocketLayer()");
#endif

    hasPendingData = false;
    if (socketEngine) {
        socketEngine->close();
        socketEngine->disconnect();
        delete socketEngine;
        socketEngine = nullptr;
        cachedSocketDescriptor = -1;
    }
    if (connectTimer)
        connectTimer->stop();
}